

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

Buffer __thiscall nvim::Nvim::get_current_buf(Nvim *this)

{
  Buffer res;
  allocator local_39;
  Buffer local_38;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"nvim_get_current_buf",&local_39);
  NvimRPC::call<>(&this->client_,&local_30,&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  return local_38;
}

Assistant:

Buffer Nvim::get_current_buf() {
    Buffer res;
    client_.call("nvim_get_current_buf", res);
    return res;
}